

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O0

bool __thiscall
DListBase<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest_*,_RealCount>::
Append<Memory::Recycler>
          (DListBase<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest_*,_RealCount> *this,
          Recycler *allocator,AsyncGeneratorRequest **data)

{
  Recycler *alloc;
  DListNode<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest_*> *this_00;
  DListNodeBase<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest_*> **ppDVar1;
  TrackAllocData local_58;
  DListNode<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest_*> *local_30;
  Node *newNode;
  AsyncGeneratorRequest **data_local;
  Recycler *allocator_local;
  DListBase<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest_*,_RealCount> *this_local;
  
  newNode = (Node *)data;
  data_local = (AsyncGeneratorRequest **)allocator;
  allocator_local = (Recycler *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,
             (type_info *)&DListNode<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest*>::typeinfo
             ,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
             ,0xf0);
  alloc = Memory::Recycler::TrackAllocInfo(allocator,&local_58);
  this_00 = (DListNode<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest_*> *)
            new<Memory::Recycler>(0x18,alloc,0x446fd0);
  DListNode<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest_*>::DListNode
            (this_00,(AsyncGeneratorRequest **)newNode);
  if (this_00 != (DListNode<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest_*> *)0x0) {
    local_30 = this_00;
    ppDVar1 = DListNodeBase<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest_*>::Prev
                        (&this->
                          super_DListNodeBase<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest_*>
                        );
    InsertNodeAfter(*ppDVar1,&local_30->
                              super_DListNodeBase<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest_*>
                   );
    RealCount::IncrementCount(&this->super_RealCount);
  }
  return this_00 != (DListNode<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest_*> *)0x0;
}

Assistant:

bool Append(TAllocator * allocator, TData const& data)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node, data);
        if (newNode)
        {
            DListBase::InsertNodeAfter(this->Prev(), newNode);
            this->IncrementCount();
            return true;
        }
        return false;
    }